

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestCaseInfo::operator==(TestCaseInfo *this,TestCaseInfo *other)

{
  __type _Var1;
  
  if ((this->m_test).m_p == (other->m_test).m_p) {
    _Var1 = std::operator==(&this->m_name,&other->m_name);
    if (_Var1) {
      _Var1 = std::operator==(&this->m_className,&other->m_className);
      return _Var1;
    }
  }
  return false;
}

Assistant:

const T* get() const{
            return m_p;
        }